

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5DlidxIter * fts5DlidxIterInit(Fts5Index *p,int bRev,int iSegid,int iLeafPg)

{
  bool bVar1;
  Fts5DlidxIter *pFVar2;
  Fts5DlidxLvl *__s;
  Fts5Data *pFVar3;
  Fts5DlidxLvl *pLvl;
  i64 iRowid;
  Fts5DlidxIter *pNew;
  sqlite3_int64 nByte;
  int bDone;
  int i;
  Fts5DlidxIter *pIter;
  int iLeafPg_local;
  int iSegid_local;
  int bRev_local;
  Fts5Index *p_local;
  
  _bDone = (Fts5DlidxIter *)0x0;
  bVar1 = false;
  nByte._4_4_ = 0;
  while (p->rc == 0 && !bVar1) {
    pFVar2 = (Fts5DlidxIter *)sqlite3_realloc64(_bDone,(long)nByte._4_4_ * 0x20 + 0x28);
    if (pFVar2 == (Fts5DlidxIter *)0x0) {
      p->rc = 7;
    }
    else {
      __s = pFVar2->aLvl + nByte._4_4_;
      memset(__s,0,0x20);
      pFVar3 = fts5DataRead(p,((long)iSegid << 0x25) + 0x1000000000 + (long)nByte._4_4_ * 0x80000000
                              + (long)iLeafPg);
      __s->pData = pFVar3;
      if ((__s->pData != (Fts5Data *)0x0) && ((*__s->pData->p & 1) == 0)) {
        bVar1 = true;
      }
      pFVar2->nLvl = nByte._4_4_ + 1;
      _bDone = pFVar2;
    }
    nByte._4_4_ = nByte._4_4_ + 1;
  }
  if (p->rc == 0) {
    _bDone->iSegid = iSegid;
    if (bRev == 0) {
      fts5DlidxIterFirst(_bDone);
    }
    else {
      fts5DlidxIterLast(p,_bDone);
    }
  }
  if (p->rc != 0) {
    fts5DlidxIterFree(_bDone);
    _bDone = (Fts5DlidxIter *)0x0;
  }
  return _bDone;
}

Assistant:

static Fts5DlidxIter *fts5DlidxIterInit(
  Fts5Index *p,                   /* Fts5 Backend to iterate within */
  int bRev,                       /* True for ORDER BY ASC */
  int iSegid,                     /* Segment id */
  int iLeafPg                     /* Leaf page number to load dlidx for */
){
  Fts5DlidxIter *pIter = 0;
  int i;
  int bDone = 0;

  for(i=0; p->rc==SQLITE_OK && bDone==0; i++){
    sqlite3_int64 nByte = sizeof(Fts5DlidxIter) + i * sizeof(Fts5DlidxLvl);
    Fts5DlidxIter *pNew;

    pNew = (Fts5DlidxIter*)sqlite3_realloc64(pIter, nByte);
    if( pNew==0 ){
      p->rc = SQLITE_NOMEM;
    }else{
      i64 iRowid = FTS5_DLIDX_ROWID(iSegid, i, iLeafPg);
      Fts5DlidxLvl *pLvl = &pNew->aLvl[i];
      pIter = pNew;
      memset(pLvl, 0, sizeof(Fts5DlidxLvl));
      pLvl->pData = fts5DataRead(p, iRowid);
      if( pLvl->pData && (pLvl->pData->p[0] & 0x0001)==0 ){
        bDone = 1;
      }
      pIter->nLvl = i+1;
    }
  }

  if( p->rc==SQLITE_OK ){
    pIter->iSegid = iSegid;
    if( bRev==0 ){
      fts5DlidxIterFirst(pIter);
    }else{
      fts5DlidxIterLast(p, pIter);
    }
  }

  if( p->rc!=SQLITE_OK ){
    fts5DlidxIterFree(pIter);
    pIter = 0;
  }

  return pIter;
}